

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O3

Int32Value * google::protobuf::Arena::CreateMaybeMessage<google::protobuf::Int32Value>(Arena *arena)

{
  Int32Value *this;
  
  if (arena == (Arena *)0x0) {
    this = (Int32Value *)operator_new(0x18);
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
    this->value_ = 0;
    this->_cached_size_ = (atomic<int>)0x0;
    (this->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__Int32Value_003bda48;
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&Int32Value::typeinfo,0x18);
    }
    this = (Int32Value *)AllocateAlignedNoHook(arena,0x18);
    Int32Value::Int32Value(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::Int32Value* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::Int32Value >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::Int32Value >(arena);
}